

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O1

void sysbvm_dwarf_debugInfo_beginLineInformation(sysbvm_dwarf_debugInfo_builder_t *builder)

{
  sysbvm_dynarray_t *dynarray;
  size_t sVar1;
  undefined4 local_2c;
  
  dynarray = &builder->line;
  local_2c = 0;
  sysbvm_dynarray_addAll(dynarray,4,&local_2c);
  local_2c = CONCAT22(local_2c._2_2_,(short)builder->version);
  sysbvm_dynarray_addAll(dynarray,2,&local_2c);
  local_2c = 0;
  sVar1 = (builder->line).size;
  sysbvm_dynarray_addAll(dynarray,4,&local_2c);
  builder->lineHeaderLengthOffset = (uint32_t)sVar1;
  local_2c._0_1_ = (char)(builder->lineProgramHeader).minimumInstructionLength;
  sysbvm_dynarray_addAll(dynarray,1,&local_2c);
  local_2c._0_1_ = (uint8_t)(builder->lineProgramHeader).maximumOperationsPerInstruction;
  sysbvm_dynarray_addAll(dynarray,1,&local_2c);
  local_2c._0_1_ = (builder->lineProgramHeader).defaultIsStatement;
  sysbvm_dynarray_addAll(dynarray,1,&local_2c);
  local_2c._0_1_ = (builder->lineProgramHeader).lineBase;
  sysbvm_dynarray_addAll(dynarray,1,&local_2c);
  local_2c._0_1_ = (builder->lineProgramHeader).lineRange;
  sysbvm_dynarray_addAll(dynarray,1,&local_2c);
  local_2c._0_1_ = (builder->lineProgramHeader).opcodeBase;
  sysbvm_dynarray_addAll(dynarray,1,&local_2c);
  local_2c._0_1_ = 0;
  sysbvm_dynarray_addAll(dynarray,1,&local_2c);
  local_2c._0_1_ = 1;
  sysbvm_dynarray_addAll(dynarray,1,&local_2c);
  local_2c._0_1_ = 1;
  sysbvm_dynarray_addAll(dynarray,1,&local_2c);
  local_2c._0_1_ = 1;
  sysbvm_dynarray_addAll(dynarray,1,&local_2c);
  local_2c._0_1_ = 1;
  sysbvm_dynarray_addAll(dynarray,1,&local_2c);
  local_2c._0_1_ = 0;
  sysbvm_dynarray_addAll(dynarray,1,&local_2c);
  local_2c._0_1_ = 0;
  sysbvm_dynarray_addAll(dynarray,1,&local_2c);
  local_2c._0_1_ = 0;
  sysbvm_dynarray_addAll(dynarray,1,&local_2c);
  local_2c._0_1_ = 1;
  sysbvm_dynarray_addAll(dynarray,1,&local_2c);
  local_2c._0_1_ = 0;
  sysbvm_dynarray_addAll(dynarray,1,&local_2c);
  local_2c._0_1_ = 0;
  sysbvm_dynarray_addAll(dynarray,1,&local_2c);
  local_2c = CONCAT31(local_2c._1_3_,1);
  sysbvm_dynarray_addAll(dynarray,1,&local_2c);
  (builder->lineProgramState).regAddress = 0;
  (builder->lineProgramState).regOpIndex = 0;
  (builder->lineProgramState).regFile = 1;
  (builder->lineProgramState).regLine = 1;
  (builder->lineProgramState).regColumn = 0;
  (builder->lineProgramState).regIsStatement = (builder->lineProgramHeader).defaultIsStatement;
  (builder->lineProgramState).regISA = 0;
  (builder->lineProgramState).regDiscriminator = false;
  (builder->lineProgramState).regBasicBlock = false;
  (builder->lineProgramState).regEndSequence = false;
  (builder->lineProgramState).regPrologueEnd = false;
  (builder->lineProgramState).regEpilogueBegin = false;
  return;
}

Assistant:

SYSBVM_API void sysbvm_dwarf_debugInfo_beginLineInformation(sysbvm_dwarf_debugInfo_builder_t *builder)
{
    sysbvm_dwarf_encodeDWord(&builder->line, 0);
    sysbvm_dwarf_encodeWord(&builder->line, builder->version);
    builder->lineHeaderLengthOffset = (uint32_t)sysbvm_dwarf_encodeDWord(&builder->line, 0); // Header length
    sysbvm_dwarf_encodeByte(&builder->line, builder->lineProgramHeader.minimumInstructionLength);
    sysbvm_dwarf_encodeByte(&builder->line, builder->lineProgramHeader.maximumOperationsPerInstruction);
    sysbvm_dwarf_encodeByte(&builder->line, builder->lineProgramHeader.defaultIsStatement);
    sysbvm_dwarf_encodeByte(&builder->line, builder->lineProgramHeader.lineBase);
    sysbvm_dwarf_encodeByte(&builder->line, builder->lineProgramHeader.lineRange);
    sysbvm_dwarf_encodeByte(&builder->line, builder->lineProgramHeader.opcodeBase);

    sysbvm_dwarf_encodeByte(&builder->line, 0); // DW_LNS_copy
    sysbvm_dwarf_encodeByte(&builder->line, 1); // DW_LNS_advance_pc
    sysbvm_dwarf_encodeByte(&builder->line, 1); // DW_LNS_advance_line
    sysbvm_dwarf_encodeByte(&builder->line, 1); // DW_LNS_set_file
    sysbvm_dwarf_encodeByte(&builder->line, 1); // DW_LNS_set_column
    sysbvm_dwarf_encodeByte(&builder->line, 0); // DW_LNS_negate_stmt
    sysbvm_dwarf_encodeByte(&builder->line, 0); // DW_LNS_set_basic_block
    sysbvm_dwarf_encodeByte(&builder->line, 0); // DW_LNS_const_add_pc
    sysbvm_dwarf_encodeByte(&builder->line, 1); // DW_LNS_fixed_advance_pc
    sysbvm_dwarf_encodeByte(&builder->line, 0); // DW_LNS_set_prologue_end
    sysbvm_dwarf_encodeByte(&builder->line, 0); // DW_LNS_set_epilogue_begin
    sysbvm_dwarf_encodeByte(&builder->line, 1); // DW_LNS_set_isa

    builder->lineProgramState.regAddress = 0;
    builder->lineProgramState.regOpIndex = 0;
    builder->lineProgramState.regFile = 1;
    builder->lineProgramState.regLine = 1;
    builder->lineProgramState.regColumn = 0;
    builder->lineProgramState.regIsStatement = builder->lineProgramHeader.defaultIsStatement;
    builder->lineProgramState.regBasicBlock = false;
    builder->lineProgramState.regEndSequence = false;
    builder->lineProgramState.regPrologueEnd = false;
    builder->lineProgramState.regEpilogueBegin = false;
    builder->lineProgramState.regISA = 0;
    builder->lineProgramState.regDiscriminator = false;
}